

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O3

void __thiscall ADSBfiConnection::Main(ADSBfiConnection *this)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__atime;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar1;
  bool bVar2;
  int iVar3;
  cv_status cVar4;
  rep rVar5;
  unique_lock<std::mutex> lk;
  ThreadSettings TS;
  positionTy pos;
  unique_lock<std::mutex> local_98;
  ThreadSettings local_88;
  positionTy local_78;
  
  ThreadSettings::ThreadSettings(&local_88,"LT_adsb_fi",0x1fbf,"C");
  __atime = &(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
             tNextWakeup;
  do {
    iVar3 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel
              ._vptr_LTChannel[4])(this);
    if ((char)iVar3 == '\0') {
      ThreadSettings::~ThreadSettings(&local_88);
      return;
    }
    rVar5 = std::chrono::_V2::steady_clock::now();
    (__atime->__d).__r = rVar5;
    DataRefs::GetViewPos();
    bVar2 = positionTy::isNormal(&local_78,false);
    if (bVar2) {
      ptVar1 = &(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.
                super_LTChannel.tNextWakeup;
      (ptVar1->__d).__r = (ptVar1->__d).__r + (long)dataRefs.fdCurrRefrIntvl * 1000000000;
      iVar3 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.
                super_LTChannel._vptr_LTChannel[0x10])(this);
      if ((char)iVar3 != '\0') {
        iVar3 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.
                  super_LTChannel._vptr_LTChannel[0x11])(this);
        if ((char)iVar3 != '\0') {
          (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
            _vptr_LTChannel[9])(this);
        }
      }
    }
    else {
      (__atime->__d).__r = (__atime->__d).__r + 1000000000;
    }
    local_98._M_device = &FDThreadSynchMutex;
    local_98._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_98);
    local_98._M_owns = true;
    do {
      iVar3 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.
                super_LTChannel._vptr_LTChannel[4])(this);
      if ((char)iVar3 == '\0') goto LAB_001496db;
      cVar4 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((condition_variable *)FDThreadSynchCV,&local_98,__atime);
    } while (cVar4 != timeout);
    (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
      _vptr_LTChannel[4])(this);
LAB_001496db:
    std::unique_lock<std::mutex>::~unique_lock(&local_98);
  } while( true );
}

Assistant:

void ADSBfiConnection::Main ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_adsb_fi", LC_ALL_MASK);
    
    while ( shallRun() ) {
        // LiveTraffic Top Level Exception Handling
        try {
            // basis for determining when to be called next
            tNextWakeup = std::chrono::steady_clock::now();
            
            // where are we right now?
            const positionTy pos (dataRefs.GetViewPos());
            
            // If the camera position is valid we can request data around it
            if (pos.isNormal()) {
                // Next wakeup is "refresh interval" from _now_
                tNextWakeup += std::chrono::seconds(dataRefs.GetFdRefreshIntvl());
                
                // fetch data and process it
                if (FetchAllData(pos) && ProcessFetchedData())
                        // reduce error count if processed successfully
                        // as a chance to appear OK in the long run
                        DecErrCnt();
            }
            else {
                // Camera position is yet invalid, retry in a second
                tNextWakeup += std::chrono::seconds(1);
            }
            
            // sleep for FD_REFRESH_INTVL or if woken up for termination
            // by condition variable trigger
            {
                std::unique_lock<std::mutex> lk(FDThreadSynchMutex);
                FDThreadSynchCV.wait_until(lk, tNextWakeup,
                                           [this]{return !shallRun();});
            }
            
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            IncErrCnt();
        } catch (...) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
            IncErrCnt();
        }
    }
}